

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

int rsa1_loadpub_s(BinarySource *src,BinarySink *bs,char **commentptr,char **errorstr)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  char *__s;
  size_t sVar4;
  size_t sVar5;
  mp_int *x;
  size_t sVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  ptrlen pVar10;
  char *error;
  RSAKey key;
  char *local_90;
  char *local_88;
  char *local_80;
  RSAKey local_78;
  
  local_90 = (char *)0x0;
  pVar10.len = 0x21;
  pVar10.ptr = "SSH PRIVATE KEY FILE FORMAT 1.1\n";
  _Var2 = expect_signature(src,pVar10);
  BinarySource_REWIND_TO__(src->binarysource_,0);
  if (_Var2) {
    local_78.iqmp = (mp_int *)0x0;
    local_78.comment = (char *)0x0;
    local_78.p = (mp_int *)0x0;
    local_78.q = (mp_int *)0x0;
    local_78.exponent = (mp_int *)0x0;
    local_78.private_exponent = (mp_int *)0x0;
    local_78.bits = 0;
    local_78.bytes = 0;
    local_78.modulus = (mp_int *)0x0;
    local_78.sshk.vt = (ssh_keyalg *)0x0;
    iVar3 = rsa1_load_s_internal(src,&local_78,true,commentptr,(char *)0x0,&local_90);
    if (iVar3 == 0) {
      bVar1 = 1;
      iVar7 = 0;
    }
    else {
      bVar1 = 0;
      rsa_ssh1_public_blob(bs,&local_78,RSA_SSH1_EXPONENT_FIRST);
      freersakey(&local_78);
      iVar7 = 1;
    }
    goto LAB_0012692b;
  }
  pVar10 = BinarySource_get_chomped_line(src->binarysource_);
  __s = mkstr(pVar10);
  sVar4 = strspn(__s,"0123456789");
  if (__s[sVar4] == ' ') {
    pcVar8 = __s + sVar4;
    *pcVar8 = '\0';
    sVar4 = strspn(pcVar8 + 1,"0123456789");
    if (pcVar8[sVar4 + 1] != ' ') goto LAB_001268fc;
    pcVar9 = pcVar8 + sVar4 + 1;
    local_80 = pcVar8 + sVar4 + 2;
    *pcVar9 = '\0';
    sVar5 = strspn(local_80,"0123456789");
    if (pcVar8[sVar5 + sVar4 + 2] == '\0') {
      local_88 = (char *)0x0;
    }
    else {
      if (pcVar8[sVar5 + sVar4 + 2] != ' ') goto LAB_001268fc;
      pcVar9[sVar5 + 1] = '\0';
      local_88 = pcVar9 + sVar5 + 2;
    }
    local_78.iqmp = (mp_int *)0x0;
    local_78.comment = (char *)0x0;
    local_78.p = (mp_int *)0x0;
    local_78.q = (mp_int *)0x0;
    local_78.exponent = (mp_int *)0x0;
    local_78.private_exponent = (mp_int *)0x0;
    local_78.bits = 0;
    local_78.bytes = 0;
    local_78.modulus = (mp_int *)0x0;
    local_78.sshk.vt = (ssh_keyalg *)0x0;
    local_78.exponent = mp_from_decimal(pcVar8 + 1);
    x = mp_from_decimal(local_80);
    local_78.modulus = x;
    iVar3 = atoi(__s);
    sVar6 = mp_get_nbits(x);
    if (sVar6 == (long)iVar3) {
      if (commentptr != (char **)0x0) {
        if (local_88 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar8 = dupstr(local_88);
        }
        *commentptr = pcVar8;
      }
      rsa_ssh1_public_blob(bs,&local_78,RSA_SSH1_EXPONENT_FIRST);
      freersakey(&local_78);
      safefree(__s);
      iVar3 = 1;
    }
    else {
      mp_free(local_78.exponent);
      mp_free(local_78.modulus);
      safefree(__s);
      local_90 = "key bit count does not match in SSH-1 public key file";
      iVar3 = 3;
    }
  }
  else {
LAB_001268fc:
    safefree(__s);
    local_90 = "not an SSH-1 RSA file";
    iVar3 = 0;
  }
  bVar1 = 1;
  iVar7 = 0;
  if ((iVar3 != 3) && (iVar7 = 0, iVar3 != 0)) {
    return 1;
  }
LAB_0012692b:
  if (!(bool)(bVar1 ^ 1 | errorstr == (char **)0x0)) {
    *errorstr = local_90;
  }
  return iVar7;
}

Assistant:

int rsa1_loadpub_s(BinarySource *src, BinarySink *bs,
                   char **commentptr, const char **errorstr)
{
    RSAKey key;
    int ret;
    const char *error = NULL;

    /* Default return if we fail. */
    ret = 0;

    bool is_privkey_file = expect_signature(src, rsa1_signature);
    BinarySource_REWIND(src);

    if (is_privkey_file) {
        /*
         * Load just the public half from an SSH-1 private key file.
         */
        memset(&key, 0, sizeof(key));
        if (rsa1_load_s_internal(src, &key, true, commentptr, NULL, &error)) {
            rsa_ssh1_public_blob(bs, &key, RSA_SSH1_EXPONENT_FIRST);
            freersakey(&key);
            ret = 1;
        }
    } else {
        /*
         * Try interpreting the file as an SSH-1 public key.
         */
        char *line, *p, *bitsp, *expp, *modp, *commentp;

        line = mkstr(get_chomped_line(src));
        p = line;

        bitsp = p;
        p += strspn(p, "0123456789");
        if (*p != ' ')
            goto not_public_either;
        *p++ = '\0';

        expp = p;
        p += strspn(p, "0123456789");
        if (*p != ' ')
            goto not_public_either;
        *p++ = '\0';

        modp = p;
        p += strspn(p, "0123456789");
        if (*p) {
            if (*p != ' ')
                goto not_public_either;
            *p++ = '\0';
            commentp = p;
        } else {
            commentp = NULL;
        }

        memset(&key, 0, sizeof(key));
        key.exponent = mp_from_decimal(expp);
        key.modulus = mp_from_decimal(modp);
        if (atoi(bitsp) != mp_get_nbits(key.modulus)) {
            mp_free(key.exponent);
            mp_free(key.modulus);
            sfree(line);
            error = "key bit count does not match in SSH-1 public key file";
            goto end;
        }
        if (commentptr)
            *commentptr = commentp ? dupstr(commentp) : NULL;
        rsa_ssh1_public_blob(bs, &key, RSA_SSH1_EXPONENT_FIRST);
        freersakey(&key);
        sfree(line);
        return 1;

      not_public_either:
        sfree(line);
        error = "not an SSH-1 RSA file";
    }

  end:
    if ((ret != 1) && errorstr)
        *errorstr = error;
    return ret;
}